

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void print_volume_bar(FILE *out,uint size,double vol)

{
  char local_31;
  double ref;
  uint i;
  double vol_local;
  uint size_local;
  FILE *out_local;
  
  if (1 < size) {
    fprintf((FILE *)out,"[");
    for (ref._4_4_ = 0; ref._4_4_ < size; ref._4_4_ = ref._4_4_ + 1) {
      local_31 = '*';
      if (vol <= (double)ref._4_4_ / (double)size) {
        local_31 = '-';
      }
      fprintf((FILE *)out,"%c",(ulong)(uint)(int)local_31);
    }
    fprintf((FILE *)out,"]");
  }
  return;
}

Assistant:

static void print_volume_bar(FILE *out, unsigned size, double vol)
{
    if (size < 2)
        return;
    fprintf(out, "[");
    for (unsigned i = 0; i < size; ++i) {
        double ref = (double)i / size;
        fprintf(out, "%c", (vol > ref) ? '*' : '-');
    }
    fprintf(out, "]");
}